

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.cpp
# Opt level: O2

bool spvExpandOperandSequenceOnce(spv_operand_type_t type,spv_operand_pattern_t *pattern)

{
  spv_operand_type_t local_18;
  spv_operand_type_t local_14;
  
  local_14 = type;
  switch(type) {
  case SPV_OPERAND_TYPE_FIRST_VARIABLE_TYPE:
    std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::push_back
              (pattern,&local_14);
    _local_18 = CONCAT44(local_14,0x2a);
    break;
  case SPV_OPERAND_TYPE_VARIABLE_LITERAL_INTEGER:
    std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::push_back
              (pattern,&local_14);
    _local_18 = CONCAT44(local_14,0x2d);
    break;
  case SPV_OPERAND_TYPE_VARIABLE_LITERAL_INTEGER_ID:
    std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::push_back
              (pattern,&local_14);
    local_18 = SPV_OPERAND_TYPE_ID;
    std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::
    emplace_back<spv_operand_type_t>(pattern,&local_18);
    _local_18 = CONCAT44(local_14,0x2f);
    break;
  case SPV_OPERAND_TYPE_LAST_OPTIONAL_TYPE:
    std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::push_back
              (pattern,&local_14);
    local_18 = SPV_OPERAND_TYPE_LITERAL_INTEGER;
    std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::
    emplace_back<spv_operand_type_t>(pattern,&local_18);
    _local_18 = CONCAT44(local_14,0x2a);
    break;
  default:
    return false;
  }
  std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::
  emplace_back<spv_operand_type_t>(pattern,&local_18);
  return true;
}

Assistant:

bool spvExpandOperandSequenceOnce(spv_operand_type_t type,
                                  spv_operand_pattern_t* pattern) {
  switch (type) {
    case SPV_OPERAND_TYPE_VARIABLE_ID:
      pattern->push_back(type);
      pattern->push_back(SPV_OPERAND_TYPE_OPTIONAL_ID);
      return true;
    case SPV_OPERAND_TYPE_VARIABLE_LITERAL_INTEGER:
      pattern->push_back(type);
      pattern->push_back(SPV_OPERAND_TYPE_OPTIONAL_LITERAL_INTEGER);
      return true;
    case SPV_OPERAND_TYPE_VARIABLE_LITERAL_INTEGER_ID:
      // Represents Zero or more (Literal number, Id) pairs,
      // where the literal number must be a scalar integer.
      pattern->push_back(type);
      pattern->push_back(SPV_OPERAND_TYPE_ID);
      pattern->push_back(SPV_OPERAND_TYPE_OPTIONAL_TYPED_LITERAL_INTEGER);
      return true;
    case SPV_OPERAND_TYPE_VARIABLE_ID_LITERAL_INTEGER:
      // Represents Zero or more (Id, Literal number) pairs.
      pattern->push_back(type);
      pattern->push_back(SPV_OPERAND_TYPE_LITERAL_INTEGER);
      pattern->push_back(SPV_OPERAND_TYPE_OPTIONAL_ID);
      return true;
    default:
      break;
  }
  return false;
}